

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::ReduceMinLayerParams::MergePartialFromCodedStream
          (ReduceMinLayerParams *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  RepeatedField<long> *pRVar5;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  ReduceMinLayerParams *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    while( true ) {
      kMax1ByteVarint = 0x7f;
      tag_2 = 0;
      _first_byte_or_zero = input;
      if ((input->buffer_ < input->buffer_end_) &&
         (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
        local_3d = local_3c[0] - 1 < kMax1ByteVarint;
        pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      tag_00 = local_10;
      if ((uStack_c & 1) == 0) goto LAB_002dbe44;
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 != 1) break;
      if ((tag_00 & 0xff) == 10) {
        pRVar5 = mutable_axes(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,pRVar5);
      }
      else {
        if ((tag_00 & 0xff) != 8) goto LAB_002dbe44;
        pRVar5 = mutable_axes(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitiveNoInline<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,10,input,pRVar5);
      }
joined_r0x002dbdd8:
      if (!bVar1) {
        return false;
      }
    }
    if (iVar2 == 2) {
      if ((tag_00 & 0xff) == 0x10) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->keepdims_);
        goto joined_r0x002dbdd8;
      }
LAB_002dbe44:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    }
    else {
      if ((iVar2 != 3) || ((tag_00 & 0xff) != 0x18)) goto LAB_002dbe44;
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (input,&this->reduceall_);
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool ReduceMinLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ReduceMinLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 axes = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_axes())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_axes())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool keepDims = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &keepdims_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reduceAll = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reduceall_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ReduceMinLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ReduceMinLayerParams)
  return false;
#undef DO_
}